

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::SerializeWithCachedSizes
          (CategoricalDistributionLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  float fVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  CategoricalDistributionLayerParams *this_local;
  
  iVar2 = seed(this);
  if (iVar2 != 0) {
    iVar2 = seed(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  iVar2 = numsamples(this);
  if (iVar2 != 0) {
    iVar2 = numsamples(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar2,output);
  }
  bVar1 = islogits(this);
  if (bVar1) {
    bVar1 = islogits(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  fVar3 = eps(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = eps(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar3,output);
  }
  fVar3 = temperature(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = temperature(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar3,output);
  }
  return;
}

Assistant:

void CategoricalDistributionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CategoricalDistributionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // int64 numSamples = 2;
  if (this->numsamples() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->numsamples(), output);
  }

  // bool isLogits = 3;
  if (this->islogits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->islogits(), output);
  }

  // float eps = 4;
  if (this->eps() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->eps(), output);
  }

  // float temperature = 5;
  if (this->temperature() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->temperature(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CategoricalDistributionLayerParams)
}